

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O2

void test_late_ack(void)

{
  int iVar1;
  quicly_sent_packet_t *pqVar2;
  quicly_sent_acked_cb p_Var3;
  quicly_sentmap_iter_t iter;
  quicly_sentmap_t map;
  
  on_acked_callcnt = 0;
  on_acked_ackcnt = 0;
  map.head = (st_quicly_sent_block_t *)0x0;
  map.tail = (st_quicly_sent_block_t *)0x0;
  map.num_packets = 0;
  map.bytes_in_flight = 0;
  map._pending_packet = (quicly_sent_t *)0x0;
  p_Var3 = (quicly_sent_acked_cb)0x1;
  quicly_sentmap_prepare(&map,1,0,'\0');
  quicly_sentmap_allocate(&map,p_Var3);
  quicly_sentmap_commit(&map,10);
  p_Var3 = (quicly_sent_acked_cb)0x2;
  quicly_sentmap_prepare(&map,2,0,'\0');
  quicly_sentmap_allocate(&map,p_Var3);
  quicly_sentmap_commit(&map,0x14);
  _ok((uint)(map.bytes_in_flight == 0x1e),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x7a);
  quicly_sentmap_init_iter(&map,&iter);
  pqVar2 = quicly_sentmap_get(&iter);
  if (pqVar2->packet_number != 1) {
    __assert_fail("sent->packet_number == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                  ,0x7f,"void test_late_ack(void)");
  }
  iVar1 = quicly_sentmap_update(&map,&iter,QUICLY_SENTMAP_EVENT_LOST);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x80);
  _ok((uint)(on_acked_callcnt == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x81);
  _ok((uint)(on_acked_ackcnt == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x82);
  _ok((uint)(map.bytes_in_flight == 0x14),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x83);
  quicly_sentmap_init_iter(&map,&iter);
  pqVar2 = quicly_sentmap_get(&iter);
  if (pqVar2->packet_number == 1) {
    iVar1 = quicly_sentmap_update(&map,&iter,QUICLY_SENTMAP_EVENT_ACKED);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
        0x89);
    pqVar2 = quicly_sentmap_get(&iter);
    if (pqVar2->packet_number == 2) {
      iVar1 = quicly_sentmap_update(&map,&iter,QUICLY_SENTMAP_EVENT_ACKED);
      _ok((uint)(iVar1 == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x8c);
      _ok((uint)(on_acked_callcnt == 3),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x8d);
      _ok((uint)(on_acked_ackcnt == 2),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x8e);
      _ok((uint)(map.bytes_in_flight == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x8f);
      quicly_sentmap_dispose(&map);
      return;
    }
    __assert_fail("sent->packet_number == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                  ,0x8b,"void test_late_ack(void)");
  }
  __assert_fail("sent->packet_number == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                ,0x88,"void test_late_ack(void)");
}

Assistant:

static void test_late_ack(void)
{
    quicly_sentmap_t map;
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;

    on_acked_callcnt = 0;
    on_acked_ackcnt = 0;

    quicly_sentmap_init(&map);

    /* commit pn 1, 2 */
    quicly_sentmap_prepare(&map, 1, 0, QUICLY_EPOCH_INITIAL);
    quicly_sentmap_allocate(&map, on_acked);
    quicly_sentmap_commit(&map, 10);
    quicly_sentmap_prepare(&map, 2, 0, QUICLY_EPOCH_INITIAL);
    quicly_sentmap_allocate(&map, on_acked);
    quicly_sentmap_commit(&map, 20);
    ok(map.bytes_in_flight == 30);

    /* mark pn 1 as lost */
    quicly_sentmap_init_iter(&map, &iter);
    sent = quicly_sentmap_get(&iter);
    assert(sent->packet_number == 1);
    ok(quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_LOST) == 0);
    ok(on_acked_callcnt == 1);
    ok(on_acked_ackcnt == 0);
    ok(map.bytes_in_flight == 20);

    /* mark pn 1, 2 as acked */
    quicly_sentmap_init_iter(&map, &iter);
    sent = quicly_sentmap_get(&iter);
    assert(sent->packet_number == 1);
    ok(quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_ACKED) == 0);
    sent = quicly_sentmap_get(&iter);
    assert(sent->packet_number == 2);
    ok(quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_ACKED) == 0);
    ok(on_acked_callcnt == 3);
    ok(on_acked_ackcnt == 2);
    ok(map.bytes_in_flight == 0);

    quicly_sentmap_dispose(&map);
}